

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

string * httplib::detail::if2ip(string *__return_storage_ptr__,string *ifn)

{
  int iVar1;
  char *pcVar2;
  pointer pcVar3;
  long *plVar4;
  ifaddrs *ifap;
  char buf [16];
  size_type __dnew;
  long *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  size_type local_28;
  
  getifaddrs(&local_40);
  if (local_40 != (long *)0x0) {
    plVar4 = local_40;
    do {
      if ((((plVar4[3] != 0) && (iVar1 = std::__cxx11::string::compare((char *)ifn), iVar1 == 0)) &&
          (*(short *)plVar4[3] == 2)) &&
         (pcVar2 = inet_ntop(2,(short *)plVar4[3] + 2,(char *)&local_38,0x10), pcVar2 != (char *)0x0
         )) {
        freeifaddrs(local_40);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        local_28 = 0x10;
        pcVar3 = (pointer)std::__cxx11::string::_M_create
                                    ((ulong *)__return_storage_ptr__,(ulong)&local_28);
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_28;
        *(undefined8 *)pcVar3 = local_38;
        *(undefined8 *)(pcVar3 + 8) = uStack_30;
        __return_storage_ptr__->_M_string_length = local_28;
        (__return_storage_ptr__->_M_dataplus)._M_p[local_28] = '\0';
        return __return_storage_ptr__;
      }
      plVar4 = (long *)*plVar4;
    } while (plVar4 != (long *)0x0);
  }
  freeifaddrs(local_40);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline std::string if2ip(const std::string &ifn) {
			struct ifaddrs *ifap;
			getifaddrs(&ifap);
			for (auto ifa = ifap; ifa; ifa = ifa->ifa_next) {
				if (ifa->ifa_addr && ifn == ifa->ifa_name) {
					if (ifa->ifa_addr->sa_family == AF_INET) {
						auto sa = reinterpret_cast<struct sockaddr_in *>(ifa->ifa_addr);
						char buf[INET_ADDRSTRLEN];
						if (inet_ntop(AF_INET, &sa->sin_addr, buf, INET_ADDRSTRLEN)) {
							freeifaddrs(ifap);
							return std::string(buf, INET_ADDRSTRLEN);
						}
					}
				}
			}
			freeifaddrs(ifap);
			return std::string();
		}